

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

int run_test_timer_ref(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 in_R9;
  uv_timer_t h;
  undefined1 auStack_148 [152];
  code *pcStack_b0;
  undefined1 local_a0 [152];
  
  pcStack_b0 = (code *)0x169222;
  uVar2 = uv_default_loop();
  pcStack_b0 = (code *)0x169232;
  uv_timer_init(uVar2,local_a0);
  pcStack_b0 = (code *)0x16923a;
  uv_unref(local_a0);
  pcStack_b0 = (code *)0x16923f;
  uVar2 = uv_default_loop();
  pcStack_b0 = (code *)0x169249;
  uv_run(uVar2,0);
  pcStack_b0 = (code *)0x169251;
  do_close(local_a0);
  pcStack_b0 = (code *)0x169256;
  uVar2 = uv_default_loop();
  pcStack_b0 = (code *)0x16926a;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_b0 = (code *)0x169274;
  uv_run(uVar2,0);
  pcStack_b0 = (code *)0x169279;
  uVar3 = uv_default_loop();
  pcStack_b0 = (code *)0x169281;
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    return 0;
  }
  pcStack_b0 = run_test_timer_ref2;
  run_test_timer_ref_cold_1();
  pcStack_b0 = (code *)uVar2;
  uVar2 = uv_default_loop();
  uv_timer_init(uVar2,auStack_148);
  uv_timer_start(auStack_148,fail_cb,0x2a,0x2a);
  uv_unref(auStack_148);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  do_close(auStack_148);
  uVar2 = uv_default_loop();
  uv_walk(uVar2,close_walk_cb,0);
  uv_run(uVar2,0);
  uVar3 = uv_default_loop();
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    return 0;
  }
  run_test_timer_ref2_cold_1();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
          ,0x39,"fail_cb should not have been called",in_R9,uVar2);
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(timer_ref) {
  uv_timer_t h;
  uv_timer_init(uv_default_loop(), &h);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY();
  return 0;
}